

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

WeightParams *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::WeightParams>::New
          (Arena *arena)

{
  Arena *arena_local;
  WeightParams *local_28;
  WeightParams *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(local_28);
  }
  else {
    local_28 = (WeightParams *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::WeightParams::typeinfo,0x50);
    CoreML::Specification::WeightParams::WeightParams(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::WeightParams>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }